

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void WebPCopyPlane(uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int width,int height)

{
  for (; 0 < height; height = height + -1) {
    memcpy(dst,src,(long)width);
    src = src + src_stride;
    dst = dst + dst_stride;
  }
  return;
}

Assistant:

void WebPCopyPlane(const uint8_t* src, int src_stride,
                   uint8_t* dst, int dst_stride, int width, int height) {
  assert(src != NULL && dst != NULL);
  assert(abs(src_stride) >= width && abs(dst_stride) >= width);
  while (height-- > 0) {
    memcpy(dst, src, width);
    src += src_stride;
    dst += dst_stride;
  }
}